

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O0

int knownhost_writeline(LIBSSH2_KNOWNHOSTS *hosts,known_host *node,char *buf,size_t buflen,
                       size_t *outlen,int type)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  size_t salt_base64_len;
  char *saltalloc;
  size_t name_base64_len;
  char *namealloc;
  size_t key_type_len;
  char *key_type_name;
  size_t required_size;
  size_t *psStack_38;
  int type_local;
  size_t *outlen_local;
  size_t buflen_local;
  char *buf_local;
  known_host *node_local;
  LIBSSH2_KNOWNHOSTS *hosts_local;
  
  required_size._4_4_ = type;
  psStack_38 = outlen;
  outlen_local = (size_t *)buflen;
  buflen_local = (size_t)buf;
  buf_local = (char *)node;
  node_local = (known_host *)hosts;
  if (type != 1) {
    iVar1 = _libssh2_error(hosts->session,-0x21,"Unsupported type of known-host information store");
    return iVar1;
  }
  uVar2 = node->typemask & 0x3c0000;
  if (uVar2 == 0x40000) {
    key_type_len = 0;
    namealloc = (char *)0x0;
  }
  else if (uVar2 == 0x80000) {
    key_type_len = (long)"rsa-sha2-512,rsa-sha2-256,ssh-rsa" + 0x1a;
    namealloc = (char *)0x7;
  }
  else if (uVar2 == 0xc0000) {
    key_type_len = (size_t)anon_var_dwarf_a16c;
    namealloc = (char *)0x7;
  }
  else if (uVar2 == 0x100000) {
    key_type_len = (size_t)anon_var_dwarf_9e33;
    namealloc = (char *)0x13;
  }
  else if (uVar2 == 0x140000) {
    key_type_len = (size_t)anon_var_dwarf_9e4a;
    namealloc = (char *)0x13;
  }
  else if (uVar2 == 0x180000) {
    key_type_len = (size_t)anon_var_dwarf_9e55;
    namealloc = (char *)0x13;
  }
  else {
    if (uVar2 != 0x1c0000) {
      if (uVar2 == 0x3c0000) {
        key_type_len = (size_t)node->key_type_name;
        if ((char *)key_type_len != (char *)0x0) {
          namealloc = (char *)node->key_type_len;
          goto LAB_0012683f;
        }
        key_type_len = 0;
      }
      iVar1 = _libssh2_error(hosts->session,-0x21,"Unsupported type of known-host entry");
      return iVar1;
    }
    key_type_len = (size_t)anon_var_dwarf_9f5b;
    namealloc = (char *)0xb;
  }
LAB_0012683f:
  key_type_name = (char *)strlen(node->key);
  if (namealloc != (char *)0x0) {
    key_type_name = namealloc + 1 + (long)key_type_name;
  }
  if (*(long *)(buf_local + 0x58) != 0) {
    key_type_name = key_type_name + *(long *)(buf_local + 0x60) + 1;
  }
  if ((*(uint *)(buf_local + 0x2c) & 0xffff) == 2) {
    saltalloc = (char *)_libssh2_base64_encode
                                  ((LIBSSH2_SESSION *)(node_local->node).next,
                                   *(char **)(buf_local + 0x18),*(size_t *)(buf_local + 0x20),
                                   (char **)&name_base64_len);
    if (saltalloc == (char *)0x0) {
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)(node_local->node).next,-6,
                             "Unable to allocate memory for base64-encoded host name");
      return iVar1;
    }
    sVar3 = _libssh2_base64_encode
                      ((LIBSSH2_SESSION *)(node_local->node).next,*(char **)(buf_local + 0x30),
                       *(size_t *)(buf_local + 0x38),(char **)&salt_base64_len);
    if (sVar3 == 0) {
      (*(code *)(node_local->node).next[1].next)(name_base64_len,(node_local->node).next);
      iVar1 = _libssh2_error((LIBSSH2_SESSION *)(node_local->node).next,-6,
                             "Unable to allocate memory for base64-encoded salt");
      return iVar1;
    }
    key_type_name = saltalloc + sVar3 + 7 + (long)key_type_name;
    if (key_type_name <= outlen_local) {
      if ((*(long *)(buf_local + 0x58) == 0) || (namealloc == (char *)0x0)) {
        if (*(long *)(buf_local + 0x58) == 0) {
          if (namealloc == (char *)0x0) {
            snprintf((char *)buflen_local,(size_t)outlen_local,"|1|%s|%s %s\n",salt_base64_len,
                     name_base64_len,*(undefined8 *)(buf_local + 0x40));
          }
          else {
            snprintf((char *)buflen_local,(size_t)outlen_local,"|1|%s|%s %s %s\n",salt_base64_len,
                     name_base64_len,key_type_len,*(undefined8 *)(buf_local + 0x40));
          }
        }
        else {
          snprintf((char *)buflen_local,(size_t)outlen_local,"|1|%s|%s %s %s\n",salt_base64_len,
                   name_base64_len,*(undefined8 *)(buf_local + 0x40),
                   *(undefined8 *)(buf_local + 0x58));
        }
      }
      else {
        snprintf((char *)buflen_local,(size_t)outlen_local,"|1|%s|%s %s %s %s\n",salt_base64_len,
                 name_base64_len,key_type_len,*(undefined8 *)(buf_local + 0x40),
                 *(undefined8 *)(buf_local + 0x58));
      }
    }
    (*(code *)(node_local->node).next[1].next)(name_base64_len,(node_local->node).next);
    (*(code *)(node_local->node).next[1].next)(salt_base64_len,(node_local->node).next);
  }
  else {
    key_type_name = key_type_name + *(long *)(buf_local + 0x20) + 3;
    if (key_type_name <= outlen_local) {
      if ((*(long *)(buf_local + 0x58) == 0) || (namealloc == (char *)0x0)) {
        if (*(long *)(buf_local + 0x58) == 0) {
          if (namealloc == (char *)0x0) {
            snprintf((char *)buflen_local,(size_t)outlen_local,"%s %s\n",
                     *(undefined8 *)(buf_local + 0x18),*(undefined8 *)(buf_local + 0x40));
          }
          else {
            snprintf((char *)buflen_local,(size_t)outlen_local,"%s %s %s\n",
                     *(undefined8 *)(buf_local + 0x18),key_type_len,
                     *(undefined8 *)(buf_local + 0x40));
          }
        }
        else {
          snprintf((char *)buflen_local,(size_t)outlen_local,"%s %s %s\n",
                   *(undefined8 *)(buf_local + 0x18),*(undefined8 *)(buf_local + 0x40),
                   *(undefined8 *)(buf_local + 0x58));
        }
      }
      else {
        snprintf((char *)buflen_local,(size_t)outlen_local,"%s %s %s %s\n",
                 *(undefined8 *)(buf_local + 0x18),key_type_len,*(undefined8 *)(buf_local + 0x40),
                 *(undefined8 *)(buf_local + 0x58));
      }
    }
  }
  *psStack_38 = (size_t)(key_type_name + -1);
  if (outlen_local < key_type_name) {
    hosts_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)(node_local->node).next,-0x26,
                        "Known-host write buffer too small");
  }
  else {
    hosts_local._4_4_ = 0;
  }
  return hosts_local._4_4_;
}

Assistant:

static int
knownhost_writeline(LIBSSH2_KNOWNHOSTS *hosts,
                    struct known_host *node,
                    char *buf, size_t buflen,
                    size_t *outlen, int type)
{
    size_t required_size;

    const char *key_type_name;
    size_t key_type_len;

    /* we only support this single file type for now, bail out on all other
       attempts */
    if(type != LIBSSH2_KNOWNHOST_FILE_OPENSSH)
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Unsupported type of known-host information "
                              "store");

    switch(node->typemask & LIBSSH2_KNOWNHOST_KEY_MASK) {
    case LIBSSH2_KNOWNHOST_KEY_RSA1:
        key_type_name = NULL;
        key_type_len = 0;
        break;
    case LIBSSH2_KNOWNHOST_KEY_SSHRSA:
        key_type_name = "ssh-rsa";
        key_type_len = 7;
        break;
    case LIBSSH2_KNOWNHOST_KEY_SSHDSS:
        key_type_name = "ssh-dss";
        key_type_len = 7;
        break;
    case LIBSSH2_KNOWNHOST_KEY_ECDSA_256:
        key_type_name = "ecdsa-sha2-nistp256";
        key_type_len = 19;
        break;
    case LIBSSH2_KNOWNHOST_KEY_ECDSA_384:
        key_type_name = "ecdsa-sha2-nistp384";
        key_type_len = 19;
        break;
    case LIBSSH2_KNOWNHOST_KEY_ECDSA_521:
        key_type_name = "ecdsa-sha2-nistp521";
        key_type_len = 19;
        break;
    case LIBSSH2_KNOWNHOST_KEY_ED25519:
        key_type_name = "ssh-ed25519";
        key_type_len = 11;
        break;
    case LIBSSH2_KNOWNHOST_KEY_UNKNOWN:
        key_type_name = node->key_type_name;
        if(key_type_name) {
            key_type_len = node->key_type_len;
            break;
        }
        /* otherwise fallback to default and error */
        LIBSSH2_FALLTHROUGH();
    default:
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Unsupported type of known-host entry");
    }

    /* When putting together the host line there are three aspects to consider:
       - Hashed (SHA1) or unhashed hostname
       - key name or no key name (RSA1)
       - comment or no comment

       This means there are 2^3 different formats:
       ("|1|%s|%s %s %s %s\n", salt, hashed_host, key_name, key, comment)
       ("|1|%s|%s %s %s\n", salt, hashed_host, key_name, key)
       ("|1|%s|%s %s %s\n", salt, hashed_host, key, comment)
       ("|1|%s|%s %s\n", salt, hashed_host, key)
       ("%s %s %s %s\n", host, key_name, key, comment)
       ("%s %s %s\n", host, key_name, key)
       ("%s %s %s\n", host, key, comment)
       ("%s %s\n", host, key)

       Even if the buffer is too small, we have to set outlen to the number of
       characters the complete line would have taken.  We also don't write
       anything to the buffer unless we are sure we can write everything to the
       buffer. */

    required_size = strlen(node->key);

    if(key_type_len)
        required_size += key_type_len + 1; /* ' ' = 1 */
    if(node->comment)
        required_size += node->comment_len + 1; /* ' ' = 1 */

    if((node->typemask & LIBSSH2_KNOWNHOST_TYPE_MASK) ==
       LIBSSH2_KNOWNHOST_TYPE_SHA1) {
        char *namealloc;
        size_t name_base64_len;
        char *saltalloc;
        size_t salt_base64_len;

        name_base64_len = _libssh2_base64_encode(hosts->session, node->name,
                                                 node->name_len, &namealloc);
        if(!name_base64_len)
            return _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for "
                                  "base64-encoded host name");

        salt_base64_len = _libssh2_base64_encode(hosts->session,
                                                 node->salt, node->salt_len,
                                                 &saltalloc);
        if(!salt_base64_len) {
            LIBSSH2_FREE(hosts->session, namealloc);
            return _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for "
                                  "base64-encoded salt");
        }

        required_size += salt_base64_len + name_base64_len + 7;
        /* |1| + | + ' ' + \n + \0 = 7 */

        if(required_size <= buflen) {
            if(node->comment && key_type_len)
                snprintf(buf, buflen, "|1|%s|%s %s %s %s\n", saltalloc,
                         namealloc, key_type_name, node->key, node->comment);
            else if(node->comment)
                snprintf(buf, buflen, "|1|%s|%s %s %s\n", saltalloc, namealloc,
                         node->key, node->comment);
            else if(key_type_len)
                snprintf(buf, buflen, "|1|%s|%s %s %s\n", saltalloc, namealloc,
                         key_type_name, node->key);
            else
                snprintf(buf, buflen, "|1|%s|%s %s\n", saltalloc, namealloc,
                         node->key);
        }

        LIBSSH2_FREE(hosts->session, namealloc);
        LIBSSH2_FREE(hosts->session, saltalloc);
    }
    else {
        required_size += node->name_len + 3;
        /* ' ' + '\n' + \0 = 3 */

        if(required_size <= buflen) {
            if(node->comment && key_type_len)
                snprintf(buf, buflen, "%s %s %s %s\n", node->name,
                         key_type_name, node->key, node->comment);
            else if(node->comment)
                snprintf(buf, buflen, "%s %s %s\n", node->name, node->key,
                         node->comment);
            else if(key_type_len)
                snprintf(buf, buflen, "%s %s %s\n", node->name, key_type_name,
                         node->key);
            else
                snprintf(buf, buflen, "%s %s\n", node->name, node->key);
        }
    }

    /* we report the full length of the data with the trailing zero excluded */
    *outlen = required_size-1;

    if(required_size <= buflen)
        return LIBSSH2_ERROR_NONE;
    else
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                              "Known-host write buffer too small");
}